

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcconn.c
# Opt level: O0

void ipc_close(void *arg)

{
  bool bVar1;
  undefined8 local_20;
  nni_aio *aio;
  ipc_conn *c;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0xa8));
  if ((*(byte *)((long)arg + 0xa0) & 1) == 0) {
    *(undefined1 *)((long)arg + 0xa0) = 1;
    while( true ) {
      local_20 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x70));
      bVar1 = true;
      if (local_20 == (nni_aio *)0x0) {
        local_20 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x88));
        bVar1 = local_20 != (nni_aio *)0x0;
      }
      if (!bVar1) break;
      nni_aio_list_remove(local_20);
      nni_aio_finish_error(local_20,NNG_ECLOSED);
    }
    nni_posix_pfd_close((nni_posix_pfd *)((long)arg + 0x38));
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0xa8));
  return;
}

Assistant:

static void
ipc_close(void *arg)
{
	ipc_conn *c = arg;
	nni_mtx_lock(&c->mtx);
	if (!c->closed) {
		nni_aio *aio;
		c->closed = true;
		while (((aio = nni_list_first(&c->readq)) != NULL) ||
		    ((aio = nni_list_first(&c->writeq)) != NULL)) {
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, NNG_ECLOSED);
		}
		nni_posix_pfd_close(&c->pfd);
	}
	nni_mtx_unlock(&c->mtx);
}